

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk_00;
  Cut_Man_t *pMan;
  char *pcVar4;
  int fOracle;
  int c;
  Abc_Ntk_t *pNtk;
  Cut_Oracle_t *pCutOracle;
  Cut_Man_t *pCutMan;
  Cut_Params_t *pParams;
  Cut_Params_t Params;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Abc_Ntk_t *)0x0;
  Params._72_8_ = argv;
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  memset((Cut_Params_t *)&pParams,0,0x50);
  pParams._0_4_ = 5;
  pParams._4_4_ = 1000;
  Params.nBitShift = 1;
  Params.nCutSet = 1;
  Params.fFilter = 0;
  Params.fSeq = 1;
  Params.fDrop = 0;
  Params.fDag = 0;
  Params.fTree = 0;
  Params.fRecord = 0;
  Params.fLocal = 1;
  Params.fRecordAig = 0;
  Params.fFancy = 0;
  Params.fMap = 0;
  Params.fAdjust = 0;
  Extra_UtilGetoptReset();
LAB_002771fe:
  do {
    iVar2 = Extra_UtilGetopt(argc,(char **)Params._72_8_,"KMtfdxyglzamjvosh");
    if (iVar2 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar2 = Abc_NtkIsStrash(pNtk_00);
      if (iVar2 == 0) {
        Abc_Print(-1,"Cut computation is available only for AIGs (run \"strash\").\n");
        return 1;
      }
      if (((int)(uint)pParams < 3) || (0xc < (int)(uint)pParams)) {
        Abc_Print(-1,"Can only compute the cuts for %d <= K <= %d.\n",3,0xc);
        return 1;
      }
      if ((Params.fSeq != 0) && (Params.fDrop != 0)) {
        Abc_Print(-1,"Cannot compute both DAG cuts and tree cuts at the same time.\n");
        return 1;
      }
      if (Params.fMap != 0) {
        pParams._0_4_ = 6;
        Params.nBitShift = 1;
      }
      if (bVar1) {
        Params.fGlobal = 1;
      }
      pMan = Abc_NtkCuts(pNtk_00,(Cut_Params_t *)&pParams);
      if (bVar1) {
        pNtk = (Abc_Ntk_t *)Cut_OracleStart(pMan);
      }
      Cut_ManStop(pMan);
      if (bVar1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          __assert_fail("pCutOracle",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                        ,0x3156,"int Abc_CommandCut(Abc_Frame_t *, int, char **)");
        }
        Abc_NtkCutsOracle(pNtk_00,(Cut_Oracle_t *)pNtk);
        Cut_OracleStop((Cut_Oracle_t *)pNtk);
      }
      return 0;
    }
    switch(iVar2) {
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_002775b2;
      }
      pParams._0_4_ = atoi(*(char **)(Params._72_8_ + (long)globalUtilOptind * 8));
      uVar3 = (uint)pParams;
      break;
    default:
      goto LAB_002775b2;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_002775b2;
      }
      pParams._4_4_ = atoi(*(char **)(Params._72_8_ + (long)globalUtilOptind * 8));
      uVar3 = pParams._4_4_;
      break;
    case 0x61:
      Params.fLocal = Params.fLocal ^ 1;
      goto LAB_002771fe;
    case 100:
      Params.fFilter = Params.fFilter ^ 1;
      goto LAB_002771fe;
    case 0x66:
      Params.nCutSet = Params.nCutSet ^ 1;
      goto LAB_002771fe;
    case 0x67:
      Params.fDag = Params.fDag ^ 1;
      goto LAB_002771fe;
    case 0x68:
      goto LAB_002775b2;
    case 0x6a:
      Params.fFancy = Params.fFancy ^ 1;
      goto LAB_002771fe;
    case 0x6c:
      Params.fTree = Params.fTree ^ 1;
      goto LAB_002771fe;
    case 0x6d:
      Params.fRecordAig = Params.fRecordAig ^ 1;
      goto LAB_002771fe;
    case 0x6f:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002771fe;
    case 0x73:
      Params.fMap = Params.fMap ^ 1;
      goto LAB_002771fe;
    case 0x74:
      Params.nBitShift = Params.nBitShift ^ 1;
      goto LAB_002771fe;
    case 0x76:
      Params.fAdjust = Params.fAdjust ^ 1;
      goto LAB_002771fe;
    case 0x78:
      Params.fSeq = Params.fSeq ^ 1;
      goto LAB_002771fe;
    case 0x79:
      Params.fDrop = Params.fDrop ^ 1;
      goto LAB_002771fe;
    case 0x7a:
      Params.fRecord = Params.fRecord ^ 1;
      goto LAB_002771fe;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar3 < 0) {
LAB_002775b2:
      Abc_Print(-2,"usage: cut [-K num] [-M num] [-tfdcovamjsvh]\n");
      Abc_Print(-2,"\t         computes k-feasible cuts for the AIG\n");
      Abc_Print(-2,"\t-K num : max number of leaves (%d <= num <= %d) [default = %d]\n",3,0xc,
                (ulong)(uint)pParams);
      Abc_Print(-2,"\t-M num : max number of cuts stored at a node [default = %d]\n",
                (ulong)pParams._4_4_);
      pcVar4 = "no";
      if (Params.nBitShift != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle truth table computation [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.nCutSet != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-f     : toggle filtering of duplicated/dominated [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fFilter != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle dropping when fanouts are done [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fSeq != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-x     : toggle computing only DAG cuts [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fDrop != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-y     : toggle computing only tree cuts [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fDag != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-g     : toggle computing only global cuts [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fTree != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-l     : toggle computing only local cuts [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fRecord != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-z     : toggle fancy computations [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fLocal != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle recording cut functions [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fRecordAig != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggle delay-oriented FPGA mapping [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fFancy != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-j     : toggle removing fanouts due to XOR/MUX [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fMap != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle creating library of 6-var functions [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fAdjust != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cut_Params_t Params, * pParams = &Params;
    Cut_Man_t * pCutMan;
    Cut_Oracle_t * pCutOracle = NULL;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fOracle;
    extern Cut_Man_t * Abc_NtkCuts( Abc_Ntk_t * pNtk, Cut_Params_t * pParams );
    extern void Abc_NtkCutsOracle( Abc_Ntk_t * pNtk, Cut_Oracle_t * pCutOracle );

    // set defaults
    fOracle = 0;
    memset( pParams, 0, sizeof(Cut_Params_t) );
    pParams->nVarsMax    = 5;     // the max cut size ("k" of the k-feasible cuts)
    pParams->nKeepMax    = 1000;  // the max number of cuts kept at a node
    pParams->fTruth      = 1;     // compute truth tables
    pParams->fFilter     = 1;     // filter dominated cuts
    pParams->fDrop       = 0;     // drop cuts on the fly
    pParams->fDag        = 1;     // compute DAG cuts
    pParams->fTree       = 0;     // compute tree cuts
    pParams->fGlobal     = 0;     // compute global cuts
    pParams->fLocal      = 0;     // compute local cuts
    pParams->fFancy      = 0;     // compute something fancy
    pParams->fRecordAig  = 1;     // compute something fancy
    pParams->fMap        = 0;     // compute mapping delay
    pParams->fAdjust     = 0;     // removes useless fanouts
    pParams->fNpnSave    = 0;     // enables dumping truth tables
    pParams->fVerbose    = 0;     // the verbosiness flag
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KMtfdxyglzamjvosh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nVarsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nVarsMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nKeepMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nKeepMax < 0 )
                goto usage;
            break;
        case 't':
            pParams->fTruth ^= 1;
            break;
        case 'f':
            pParams->fFilter ^= 1;
            break;
        case 'd':
            pParams->fDrop ^= 1;
            break;
        case 'x':
            pParams->fDag ^= 1;
            break;
        case 'y':
            pParams->fTree ^= 1;
            break;
        case 'g':
            pParams->fGlobal ^= 1;
            break;
        case 'l':
            pParams->fLocal ^= 1;
            break;
        case 'z':
            pParams->fFancy ^= 1;
            break;
        case 'a':
            pParams->fRecordAig ^= 1;
            break;
        case 'm':
            pParams->fMap ^= 1;
            break;
        case 'j':
            pParams->fAdjust ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 'o':
            fOracle ^= 1;
            break;
        case 's':
            pParams->fNpnSave ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Cut computation is available only for AIGs (run \"strash\").\n" );
        return 1;
    }
    if ( pParams->nVarsMax < CUT_SIZE_MIN || pParams->nVarsMax > CUT_SIZE_MAX )
    {
        Abc_Print( -1, "Can only compute the cuts for %d <= K <= %d.\n", CUT_SIZE_MIN, CUT_SIZE_MAX );
        return 1;
    }
    if ( pParams->fDag && pParams->fTree )
    {
        Abc_Print( -1, "Cannot compute both DAG cuts and tree cuts at the same time.\n" );
        return 1;
    }

    if ( pParams->fNpnSave )
    {
        pParams->nVarsMax = 6;
        pParams->fTruth = 1;
    }

    if ( fOracle )
        pParams->fRecord = 1;
    pCutMan = Abc_NtkCuts( pNtk, pParams );
    if ( fOracle )
        pCutOracle = Cut_OracleStart( pCutMan );
    Cut_ManStop( pCutMan );
    if ( fOracle )
    {
        assert(pCutOracle);
        Abc_NtkCutsOracle( pNtk, pCutOracle );
        Cut_OracleStop( pCutOracle );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: cut [-K num] [-M num] [-tfdcovamjsvh]\n" );
    Abc_Print( -2, "\t         computes k-feasible cuts for the AIG\n" );
    Abc_Print( -2, "\t-K num : max number of leaves (%d <= num <= %d) [default = %d]\n",     CUT_SIZE_MIN, CUT_SIZE_MAX, pParams->nVarsMax );
    Abc_Print( -2, "\t-M num : max number of cuts stored at a node [default = %d]\n",        pParams->nKeepMax );
    Abc_Print( -2, "\t-t     : toggle truth table computation [default = %s]\n",             pParams->fTruth?   "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle filtering of duplicated/dominated [default = %s]\n",   pParams->fFilter?  "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dropping when fanouts are done [default = %s]\n",      pParams->fDrop?    "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle computing only DAG cuts [default = %s]\n",             pParams->fDag?     "yes": "no" );
    Abc_Print( -2, "\t-y     : toggle computing only tree cuts [default = %s]\n",            pParams->fTree?    "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle computing only global cuts [default = %s]\n",          pParams->fGlobal?  "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle computing only local cuts [default = %s]\n",           pParams->fLocal?   "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle fancy computations [default = %s]\n",                  pParams->fFancy?   "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle recording cut functions [default = %s]\n",             pParams->fRecordAig?"yes": "no" );
    Abc_Print( -2, "\t-m     : toggle delay-oriented FPGA mapping [default = %s]\n",         pParams->fMap?     "yes": "no" );
    Abc_Print( -2, "\t-j     : toggle removing fanouts due to XOR/MUX [default = %s]\n",     pParams->fAdjust?  "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating library of 6-var functions [default = %s]\n", pParams->fNpnSave?  "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",        pParams->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}